

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::NetStateRule::Clear(NetStateRule *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->stage_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->not_stage_).super_RepeatedPtrFieldBase);
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    this->max_level_ = 0;
    this->phase_ = 0;
    this->min_level_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void NetStateRule::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.NetStateRule)
  stage_.Clear();
  not_stage_.Clear();
  if (_has_bits_[0 / 32] & 7u) {
    ::memset(&phase_, 0, reinterpret_cast<char*>(&max_level_) -
      reinterpret_cast<char*>(&phase_) + sizeof(max_level_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}